

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

opStatus __thiscall
llvm::detail::DoubleAPFloat::addWithSpecial
          (DoubleAPFloat *this,DoubleAPFloat *LHS,DoubleAPFloat *RHS,DoubleAPFloat *Out,
          roundingMode RM)

{
  APFloat *pAVar1;
  bool bVar2;
  bool bVar3;
  fltCategory fVar4;
  fltCategory fVar5;
  opStatus oVar6;
  DoubleAPFloat *RHS_00;
  APFloat CC;
  APFloat C;
  APFloat AA;
  APFloat A;
  
  fVar4 = getCategory(LHS);
  RHS_00 = LHS;
  if ((((fVar4 != fcNaN) && (fVar5 = getCategory(RHS), RHS_00 = RHS, fVar5 != fcNaN)) &&
      (fVar4 != fcZero)) && (RHS_00 = LHS, fVar5 != fcZero)) {
    if (fVar4 == fcInfinity) {
      if (fVar5 == fcInfinity) {
        bVar2 = isNegative(LHS);
        bVar3 = isNegative(RHS);
        if (bVar2 != bVar3) {
          bVar2 = isNegative(Out);
          makeNaN(Out,false,bVar2,(APInt *)0x0);
          return opInvalidOp;
        }
      }
    }
    else {
      RHS_00 = RHS;
      if (fVar5 != fcInfinity) {
        if ((fVar4 != fcNormal) || (fVar5 != fcNormal)) {
          __assert_fail("LHS.getCategory() == fcNormal && RHS.getCategory() == fcNormal",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                        ,0xfb9,
                        "APFloat::opStatus llvm::detail::DoubleAPFloat::addWithSpecial(const DoubleAPFloat &, const DoubleAPFloat &, DoubleAPFloat &, roundingMode)"
                       );
        }
        APFloat::Storage::Storage
                  ((Storage *)&A.U.IEEE,
                   &((LHS->Floats)._M_t.
                     super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                     super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl)->U);
        APFloat::Storage::Storage
                  ((Storage *)&AA.U.IEEE,
                   &(LHS->Floats)._M_t.
                    super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t
                    .super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                    super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl[1].U);
        APFloat::Storage::Storage
                  ((Storage *)&C.U.IEEE,
                   &((RHS->Floats)._M_t.
                     super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                     super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl)->U);
        APFloat::Storage::Storage
                  ((Storage *)&CC.U.IEEE,
                   &(RHS->Floats)._M_t.
                    super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t
                    .super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                    super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl[1].U);
        if (A.U.semantics != (fltSemantics *)semIEEEdouble) {
          __assert_fail("&A.getSemantics() == &semIEEEdouble",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                        ,0xfbd,
                        "APFloat::opStatus llvm::detail::DoubleAPFloat::addWithSpecial(const DoubleAPFloat &, const DoubleAPFloat &, DoubleAPFloat &, roundingMode)"
                       );
        }
        if (AA.U.semantics != (fltSemantics *)semIEEEdouble) {
          __assert_fail("&AA.getSemantics() == &semIEEEdouble",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                        ,0xfbe,
                        "APFloat::opStatus llvm::detail::DoubleAPFloat::addWithSpecial(const DoubleAPFloat &, const DoubleAPFloat &, DoubleAPFloat &, roundingMode)"
                       );
        }
        if (C.U.semantics != (fltSemantics *)semIEEEdouble) {
          __assert_fail("&C.getSemantics() == &semIEEEdouble",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                        ,0xfbf,
                        "APFloat::opStatus llvm::detail::DoubleAPFloat::addWithSpecial(const DoubleAPFloat &, const DoubleAPFloat &, DoubleAPFloat &, roundingMode)"
                       );
        }
        if (CC.U.semantics != (fltSemantics *)semIEEEdouble) {
          __assert_fail("&CC.getSemantics() == &semIEEEdouble",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                        ,0xfc0,
                        "APFloat::opStatus llvm::detail::DoubleAPFloat::addWithSpecial(const DoubleAPFloat &, const DoubleAPFloat &, DoubleAPFloat &, roundingMode)"
                       );
        }
        pAVar1 = (Out->Floats)._M_t.
                 super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                 super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                 super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
        if ((pAVar1->U).semantics != (fltSemantics *)semIEEEdouble) {
          __assert_fail("&Out.Floats[0].getSemantics() == &semIEEEdouble",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                        ,0xfc1,
                        "APFloat::opStatus llvm::detail::DoubleAPFloat::addWithSpecial(const DoubleAPFloat &, const DoubleAPFloat &, DoubleAPFloat &, roundingMode)"
                       );
        }
        if (pAVar1[1].U.semantics == (fltSemantics *)semIEEEdouble) {
          oVar6 = addImpl(Out,&A,&AA,&C,&CC,RM);
          APFloat::Storage::~Storage((Storage *)&CC.U.IEEE);
          APFloat::Storage::~Storage((Storage *)&C.U.IEEE);
          APFloat::Storage::~Storage((Storage *)&AA.U.IEEE);
          APFloat::Storage::~Storage((Storage *)&A.U.IEEE);
          return oVar6;
        }
        __assert_fail("&Out.Floats[1].getSemantics() == &semIEEEdouble",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0xfc2,
                      "APFloat::opStatus llvm::detail::DoubleAPFloat::addWithSpecial(const DoubleAPFloat &, const DoubleAPFloat &, DoubleAPFloat &, roundingMode)"
                     );
      }
    }
  }
  operator=(Out,RHS_00);
  return opOK;
}

Assistant:

APFloat::opStatus DoubleAPFloat::addWithSpecial(const DoubleAPFloat &LHS,
                                                const DoubleAPFloat &RHS,
                                                DoubleAPFloat &Out,
                                                roundingMode RM) {
  if (LHS.getCategory() == fcNaN) {
    Out = LHS;
    return opOK;
  }
  if (RHS.getCategory() == fcNaN) {
    Out = RHS;
    return opOK;
  }
  if (LHS.getCategory() == fcZero) {
    Out = RHS;
    return opOK;
  }
  if (RHS.getCategory() == fcZero) {
    Out = LHS;
    return opOK;
  }
  if (LHS.getCategory() == fcInfinity && RHS.getCategory() == fcInfinity &&
      LHS.isNegative() != RHS.isNegative()) {
    Out.makeNaN(false, Out.isNegative(), nullptr);
    return opInvalidOp;
  }
  if (LHS.getCategory() == fcInfinity) {
    Out = LHS;
    return opOK;
  }
  if (RHS.getCategory() == fcInfinity) {
    Out = RHS;
    return opOK;
  }
  assert(LHS.getCategory() == fcNormal && RHS.getCategory() == fcNormal);

  APFloat A(LHS.Floats[0]), AA(LHS.Floats[1]), C(RHS.Floats[0]),
      CC(RHS.Floats[1]);
  assert(&A.getSemantics() == &semIEEEdouble);
  assert(&AA.getSemantics() == &semIEEEdouble);
  assert(&C.getSemantics() == &semIEEEdouble);
  assert(&CC.getSemantics() == &semIEEEdouble);
  assert(&Out.Floats[0].getSemantics() == &semIEEEdouble);
  assert(&Out.Floats[1].getSemantics() == &semIEEEdouble);
  return Out.addImpl(A, AA, C, CC, RM);
}